

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O3

void I_NetCmd(void)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  char *pcVar6;
  ulong uVar7;
  in_addr *piVar8;
  ulong uVar9;
  FString FStack_48;
  undefined1 auStack_40 [16];
  undefined8 uStack_30;
  socklen_t sStack_24;
  
  if (doomcom.command != 2) {
    if (doomcom.command == 1) {
      PacketSend();
      return;
    }
    I_Error("Bad net cmd: %i\n",(ulong)(uint)(int)doomcom.command);
    return;
  }
  sStack_24 = 0x10;
  uVar9 = 0;
  uVar2 = recvfrom(mysocket,TransmitBuffer,8000,0,(sockaddr *)auStack_40,&sStack_24);
  iVar1 = (int)uVar2;
  if (doomcom.numnodes < 1) {
LAB_004ebf2c:
    uVar7 = 0xffffffff;
    if ((uint)uVar9 != (int)doomcom.numnodes) {
      uVar7 = uVar9 & 0xffffffff;
    }
    if (iVar1 == -1 && -1 < (int)uVar7) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      if (iVar1 == 0xb) {
        doomcom.remotenode = -1;
        return;
      }
      if (iVar1 == 0x68) {
        puVar4 = (undefined8 *)
                 ((ulong)(((&DAT_00a602d8)[(ulong)sendplayer[uVar7] * 0xa8] - 1 & 0x1cf) * 0x18) +
                 (&DAT_00a602c8)[(ulong)sendplayer[uVar7] * 0x54]);
        if (StartScreen == (FStartupScreen *)0x0) {
          do {
            puVar5 = puVar4;
            puVar4 = (undefined8 *)*puVar5;
          } while (*(int *)(puVar5 + 1) != 0x1cf);
          Printf("The connection from %s was dropped.\n",*(undefined8 *)(puVar5[2] + 0x28));
        }
        else {
          do {
            puVar5 = puVar4;
            puVar4 = (undefined8 *)*puVar5;
          } while (*(int *)(puVar5 + 1) != 0x1cf);
          (*StartScreen->_vptr_FStartupScreen[7])
                    (StartScreen,"The connection from %s was dropped.\n",
                     *(undefined8 *)(puVar5[2] + 0x28));
        }
        doomcom.data[0] = 0x80;
        uVar2 = 1;
        goto LAB_004ec10a;
      }
      pcVar6 = strerror(iVar1);
      I_Error("GetPacket: %s",pcVar6);
      uVar2 = 0xffffffff;
    }
    else {
      if (iVar1 < 1 || (int)uVar7 < 0) {
        if (0 < iVar1) goto LAB_004ec04f;
        goto LAB_004ec10a;
      }
      doomcom.data[0] = TransmitBuffer[0] & 0xfb;
      if ((TransmitBuffer[0] & 4) == 0) {
        memcpy(doomcom.data + 1,TransmitBuffer + 1,(ulong)(iVar1 - 1));
      }
      else {
        uStack_30 = 13999;
        iVar1 = uncompress(0xa51db5,&uStack_30,TransmitBuffer + 1,iVar1 + -1);
        if (iVar1 != 0) {
          M_ZLibError((int)&FStack_48);
          Printf("Net decompression failed (zlib error %s)\n",FStack_48.Chars);
          FString::~FString(&FStack_48);
          doomcom.remotenode = -1;
          return;
        }
        uVar2 = (ulong)((int)uStack_30 + 1);
      }
    }
    uVar7 = uVar9 & 0xffffffff;
  }
  else {
    piVar8 = &sendaddress[0].sin_addr;
    uVar9 = 0;
    do {
      if ((auStack_40._4_4_ == piVar8->s_addr) &&
         (auStack_40._2_2_ == ((sockaddr_in *)(piVar8 + -1))->sin_port)) goto LAB_004ebf2c;
      uVar9 = uVar9 + 1;
      piVar8 = piVar8 + 4;
    } while ((uint)(int)doomcom.numnodes != uVar9);
    if (0 < iVar1) {
LAB_004ec04f:
      if (((iVar1 != 2) || (TransmitBuffer[0] != '0')) || (TransmitBuffer[1] != '\x02')) {
        pcVar6 = inet_ntoa((in_addr)auStack_40._4_4_);
        DPrintf(2,"Dropped packet: Unknown host (%s:%d)\n",pcVar6,(ulong)(ushort)auStack_40._2_2_);
      }
      doomcom.remotenode = -1;
      return;
    }
    uVar7 = 0xffffffff;
  }
LAB_004ec10a:
  doomcom.datalength = (SWORD)uVar2;
  doomcom.remotenode = (SWORD)uVar7;
  return;
}

Assistant:

void I_NetCmd (void)
{
	if (doomcom.command == CMD_SEND)
	{
		PacketSend ();
	}
	else if (doomcom.command == CMD_GET)
	{
		PacketGet ();
	}
	else
		I_Error ("Bad net cmd: %i\n",doomcom.command);
}